

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

void CVmBifNet::get_event(uint oargc)

{
  OS_Counter *pOVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  TadsMessage *pTVar4;
  err_frame_t *peVar5;
  CVmException *pCVar6;
  __pid_t _Var7;
  int iVar8;
  uint uVar9;
  vm_obj_id_t vVar10;
  undefined8 *puVar11;
  long *plVar12;
  char *str;
  void *__stat_loc;
  TadsMessage *pTVar13;
  int argc;
  TadsMessage *msg;
  int evt_code;
  err_frame_t err_cur__;
  
  CVmBif::check_argc_range(oargc,0,1);
  __stat_loc = (void *)0xffffffffffffffff;
  if (oargc != 0) {
    if (sp_[-1].typ == VM_NIL) {
      sp_ = sp_ + -1;
    }
    else {
      iVar8 = CVmBif::pop_int_val();
      __stat_loc = (void *)(long)iVar8;
    }
  }
  vVar10 = G_predef_X.net_event;
  msg = (TadsMessage *)0x0;
  _Var7 = TadsMessageQueue::wait(G_net_queue_X,__stat_loc);
  pTVar4 = msg;
  if (msg == (TadsMessage *)0x0) {
    pTVar13 = (TadsMessage *)0x0;
  }
  else {
    iVar8 = strcmp(msg->typ,"TadsEventMessage");
    pTVar13 = (TadsMessage *)0x0;
    if (iVar8 == 0) {
      pTVar13 = pTVar4;
    }
  }
  puVar11 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar11;
  plVar12 = (long *)_ZTW11G_err_frame();
  *plVar12 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  uVar9 = G_predef_X.net_timeout_event;
  pvVar3 = sp_;
  if (err_cur__.state_ != 0) goto LAB_00202cb8;
  switch(_Var7) {
  case 0:
    if (pTVar13 == (TadsMessage *)0x0) {
      str = "getNetEvent(): unexpected message type in queue";
      goto LAB_00202c3b;
    }
    uVar9 = (*(pTVar13->super_CVmRefCntObj)._vptr_CVmRefCntObj[2])(pTVar13,&argc,&evt_code);
    pvVar3 = sp_;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_INT;
    (pvVar3->val).intval = evt_code;
    argc = argc + 1;
    goto LAB_00202c63;
  case 1:
    str = "getNetEvent(): queue terminated";
    goto LAB_00202c3b;
  case 2:
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_INT;
    (pvVar3->val).obj = 3;
    uVar9 = vVar10;
    break;
  case -1:
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_INT;
    (pvVar3->val).obj = 2;
    break;
  default:
    str = "getNetEvent(): error waiting for request message";
LAB_00202c3b:
    CVmRun::push_string(&G_interpreter_X,str);
    CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.net_exception,1,str);
  }
  argc = 1;
LAB_00202c63:
  if (uVar9 == 0) {
    uVar9 = G_predef_X.net_event;
  }
  if (uVar9 == 0) {
    vVar10 = CVmObjList::create_from_stack((uchar **)0x0,argc);
    CVmBif::retval_obj(vVar10);
  }
  else {
    (**(code **)(*(long *)&G_obj_table_X.pages_[uVar9 >> 0xc][uVar9 & 0xfff].ptr_ + 0x18))
              (G_obj_table_X.pages_[uVar9 >> 0xc] + (uVar9 & 0xfff),uVar9,0);
  }
LAB_00202cb8:
  if ((-1 < (short)err_cur__.state_) &&
     (err_cur__.state_ = err_cur__.state_ | 0x8000, msg != (TadsMessage *)0x0)) {
    LOCK();
    pOVar1 = &(msg->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(msg->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
    }
  }
  peVar5 = err_cur__.prv_;
  puVar11 = (undefined8 *)_ZTW11G_err_frame();
  *puVar11 = peVar5;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar11 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar11 & 2) != 0) {
      plVar12 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar12 + 0x10));
    }
    pCVar6 = err_cur__.exc_;
    plVar12 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar12 + 0x10) = pCVar6;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CVmBifNet::get_event(VMG_ uint oargc)
{
    /* check arguments */
    check_argc_range(vmg_ oargc, 0, 1);

    /* get the timeout, if present */
    long timeout = OS_FOREVER;
    if (oargc >= 1)
    {
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            timeout = pop_int_val(vmg0_);
    }

    /* we don't know the NetEvent subclass yet, so presume the base class */
    vm_obj_id_t ev_cl = G_predef->net_event;
    int argc;

    /* get the next message */
    TadsMessage *msg = 0;
    int wret = G_net_queue->wait(vmg_ timeout, &msg);

    /* cast the message */
    TadsEventMessage *evtmsg = cast_tads_message(TadsEventMessage, msg);

    /* make sure we release the message before exiting */
    err_try
    {
        /* check the wait result */
        const char *err;
        switch (wret)
        {
        case OSWAIT_EVENT + 0:
            /* we got a message */
            if (evtmsg != 0)
            {
                /* ask the message to set up a new NetRequestEvent */
                int evt_code;
                ev_cl = evtmsg->prep_event_obj(vmg_ &argc, &evt_code);
            
                /* add the event type argument */
                G_interpreter->push_int(vmg_ evt_code);
                ++argc;
            }
            else
            {
                /* unrecognized message type */
                err = "getNetEvent(): unexpected message type in queue";
                goto evt_error;
            }
            break;

        case OSWAIT_EVENT + 1:
            /* 'quit' event - return an error */
            err = "getNetEvent(): queue terminated";
            goto evt_error;

        case OSWAIT_EVENT + 2:
            /* debug break - return a NetEvent with the interrupt code */
            argc = 1;
            G_interpreter->push_int(vmg_ VMBN_EVT_DBGBRK);
            break;
            
        case OSWAIT_TIMEOUT:
            /* the timeout expired - return a NetTimeoutEvent */
            ev_cl = G_predef->net_timeout_event;
            argc = 1;
            G_interpreter->push_int(vmg_ VMBN_EVT_TIMEOUT);
            break;

        case OSWAIT_ERROR:
        default:
            /* the wait failed */
            err = "getNetEvent(): error waiting for request message";

        evt_error:
            /* on error, throw a NetException describing the problem */
            G_interpreter->push_string(vmg_ err);
            G_interpreter->throw_new_class(
                vmg_ G_predef->net_exception, 1, err);
            AFTER_ERR_THROW(break;)
        }
        
        /* 
         *   if the specific event type subclass isn't defined, fall back on
         *   the base NetEvent class 
         */
        if (ev_cl == VM_INVALID_OBJ)
            ev_cl = G_predef->net_event;

        /* 
         *   construct the NetEvent subclass, or a generic list if we don't
         *   even have the NetEvent class defined 
         */
        if (ev_cl != VM_INVALID_OBJ)
            vm_objp(vmg_ ev_cl)->create_instance(vmg_ ev_cl, 0, argc);
        else
            retval_obj(vmg_ CVmObjList::create_from_stack(vmg_ 0, argc));
    }